

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Interpreter.cpp
# Opt level: O0

EStatusCode __thiscall
CharStringType1Interpreter::InterpretOperator
          (CharStringType1Interpreter *this,Byte inBuffer,
          InputCharStringDecodeStream *inCharStringToIntepret,bool *outGotEndExecutionCommand)

{
  int iVar1;
  undefined4 extraout_var;
  byte local_37;
  ushort local_36;
  EStatusCode local_34;
  Byte buffer;
  unsigned_short operatorValue;
  bool *pbStack_30;
  EStatusCode status;
  bool *outGotEndExecutionCommand_local;
  InputCharStringDecodeStream *inCharStringToIntepret_local;
  CharStringType1Interpreter *pCStack_18;
  Byte inBuffer_local;
  CharStringType1Interpreter *this_local;
  
  local_34 = eFailure;
  *outGotEndExecutionCommand = false;
  pbStack_30 = outGotEndExecutionCommand;
  outGotEndExecutionCommand_local = (bool *)inCharStringToIntepret;
  inCharStringToIntepret_local._7_1_ = inBuffer;
  pCStack_18 = this;
  if (inBuffer == '\f') {
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&local_37,1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      return eFailure;
    }
    local_36 = local_37 + 0xc00;
  }
  else {
    local_36 = (ushort)inBuffer;
  }
  if (local_36 == 1) {
    local_34 = InterpretHStem(this);
  }
  else if (local_36 == 3) {
    local_34 = InterpretVStem(this);
  }
  else if (local_36 == 4) {
    local_34 = InterpretVMoveto(this);
  }
  else if (local_36 == 5) {
    local_34 = InterpretRLineto(this);
  }
  else if (local_36 == 6) {
    local_34 = InterpretHLineto(this);
  }
  else if (local_36 == 7) {
    local_34 = InterpretVLineto(this);
  }
  else if (local_36 == 8) {
    local_34 = InterpretRRCurveto(this);
  }
  else if (local_36 == 9) {
    local_34 = InterpretClosePath(this);
  }
  else if (local_36 == 10) {
    local_34 = InterpretCallSubr(this);
  }
  else if (local_36 == 0xb) {
    local_34 = InterpretReturn(this);
    *pbStack_30 = true;
  }
  else if (local_36 == 0xd) {
    local_34 = InterpretHsbw(this);
  }
  else if (local_36 == 0xe) {
    local_34 = InterpretEndChar(this);
  }
  else if (local_36 == 0x15) {
    local_34 = InterpretRMoveto(this);
  }
  else if (local_36 == 0x16) {
    local_34 = InterpretHMoveto(this);
  }
  else if (local_36 == 0x1e) {
    local_34 = InterpretVHCurveto(this);
  }
  else if (local_36 == 0x1f) {
    local_34 = InterpretHVCurveto(this);
  }
  else if (local_36 == 0xc00) {
    local_34 = InterpretDotSection(this);
  }
  else if (local_36 == 0xc01) {
    local_34 = InterpretVStem3(this);
  }
  else if (local_36 == 0xc02) {
    local_34 = InterpretHStem3(this);
  }
  else if (local_36 == 0xc06) {
    local_34 = InterpretSeac(this);
  }
  else if (local_36 == 0xc07) {
    local_34 = InterpretSbw(this);
  }
  else if (local_36 == 0xc0c) {
    local_34 = InterpretDiv(this);
  }
  else if (local_36 == 0xc10) {
    local_34 = InterpretCallOtherSubr(this);
  }
  else if (local_36 == 0xc11) {
    local_34 = InterpretPop(this);
  }
  else if (local_36 == 0xc21) {
    local_34 = InterpretSetCurrentPoint(this);
  }
  return local_34;
}

Assistant:

EStatusCode CharStringType1Interpreter::InterpretOperator(Byte inBuffer,InputCharStringDecodeStream* inCharStringToIntepret,bool& outGotEndExecutionCommand)
{
	EStatusCode status = eFailure;
	unsigned short operatorValue;
	outGotEndExecutionCommand = false;
	Byte buffer;
	
	if(12 == inBuffer)
	{
		if(inCharStringToIntepret->Read(&buffer,1) != 1)
			return eFailure;

		operatorValue = 0x0c00 + buffer;
	}
	else
	{
		operatorValue = inBuffer;
	}

	switch(operatorValue)
	{
		case 1: // hstem
			status = InterpretHStem();
			break;
		case 3: // vstem
			status = InterpretVStem();
			break;
		case 4: // vmoveto
			status = InterpretVMoveto();
			break;
		case 5: // rlineto
			status = InterpretRLineto();
			break;
		case 6: // hlineto
			status = InterpretHLineto();
			break;
		case 7: // vlineto
			status = InterpretVLineto();
			break;
		case 8: // rrcurveto
			status = InterpretRRCurveto();
			break;
		case 9: // closepath
			status = InterpretClosePath();
			break;
		case 10: // callsubr
			status = InterpretCallSubr();
			break;
		case 11: // return
			status = InterpretReturn();
			outGotEndExecutionCommand = true;
			break;
		case 13: // hsbw
			status = InterpretHsbw();
			break;
		case 14: // endchar
			status = InterpretEndChar();
			break;
		case 21: // rmoveto
			status = InterpretRMoveto();
			break;
		case 22: // hmoveto
			status = InterpretHMoveto();
			break;
		case 30: // vhcurveto
			status = InterpretVHCurveto();
			break;
		case 31: // hvcurveto
			status = InterpretHVCurveto();
			break;
		
		case 0x0c00: // dotsection
			status = InterpretDotSection();
			break;
		case 0x0c01: // vstem3
			status = InterpretVStem3();
			break;
		case 0x0c02: // hstem3
			status = InterpretHStem3();
			break;
		case 0x0c06: // seac
			status = InterpretSeac();
			break;
		case 0x0c07: // sbw
			status = InterpretSbw();
			break;
		case 0x0c0c: // div
			status = InterpretDiv();
			break;
		case 0x0c10: // callothersubr
			status = InterpretCallOtherSubr();
			break;
		case 0x0c11: // pop
			status = InterpretPop();
			break;
		case 0x0c21: // setcurrentpoint
			status = InterpretSetCurrentPoint();
			break;
	}
	return status;	
}